

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

void CVmObjBigNum::compute_sqrt_into(char *dst,char *src)

{
  ushort uVar1;
  short sVar2;
  char *pcVar3;
  char *pcVar4;
  err_frame_t *peVar5;
  CVmException *pCVar6;
  int16_t tmp;
  ulong uVar7;
  ulong uVar8;
  long *in_FS_OFFSET;
  char *ext1;
  char *ext4;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext3;
  char *ext2;
  err_frame_t err_cur__;
  
  if ((src[4] & 1U) != 0) {
    err_throw(0x7eb);
  }
  uVar1 = *(ushort *)dst;
  alloc_temp_regs((ulong)uVar1 + 3,4,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4);
  G_err_frame::__tls_init();
  err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    copy_val(ext1,src,1);
    sVar2 = *(short *)(ext1 + 2);
    if (((int)sVar2 & 1U) == 0) {
      *(short *)(ext1 + 2) = (short)((uint)(int)(short)(sVar2 - (sVar2 >> 0xf)) >> 1);
      mul_by_long(ext1,2);
    }
    else {
      *(short *)(ext1 + 2) = (short)((int)sVar2 + 1U >> 1);
      div_by_long(ext1,2,(unsigned_long *)0x0);
    }
    if ((ext1[4] & 8U) == 0) {
      do {
        compute_quotient_into(ext3,(char *)0x0,src,ext1);
        compute_sum_into(ext4,ext1,ext3);
        div_by_long(ext4,2,(unsigned_long *)0x0);
        pcVar4 = ext4;
        pcVar3 = ext1;
        if ((((ext4[4] ^ ext1[4]) & 1U) == 0) && (*(short *)(ext1 + 2) == *(short *)(ext4 + 2))) {
          uVar7 = 0;
          uVar8 = uVar7;
          while (((byte)(ext4[(uVar7 >> 1) + 5] ^ ext1[(uVar7 >> 1) + 5]) >> (~(byte)uVar8 & 4) &
                 0xf) == 0) {
            uVar7 = uVar7 + 1;
            uVar8 = (ulong)((int)uVar8 + 4);
            if ((ulong)uVar1 + 1 == uVar7) goto LAB_00266e9e;
          }
        }
        ext1 = ext4;
        ext4 = pcVar3;
      } while ((pcVar4[4] & 8U) == 0);
    }
LAB_00266e9e:
    copy_val(dst,ext1,1);
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    release_temp_regs(4,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4);
  }
  peVar5 = err_cur__.prv_;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)peVar5;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pCVar6 = err_cur__.exc_;
    G_err_frame::__tls_init();
    *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar6;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_sqrt_into(char *dst, const char *src)
{
    uint hdl1, hdl2, hdl3, hdl4;
    char *ext1, *ext2, *ext3, *ext4;
    size_t dst_prec = get_prec(dst);

    /* if the value is negative, it's an error */
    if (get_neg(src))
        err_throw(VMERR_OUT_OF_RANGE);
    
    /* allocate our scratchpad registers */
    alloc_temp_regs(get_prec(dst) + 3, 4,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4);

    /* catch errors so we can free our registers */
    err_try
    {
        /* 
         *   Compute our initial guess.  Since our number is represented as
         *   
         *   (n * 10^exp),
         *   
         *   the square root can be written as
         *   
         *   sqrt(n) * sqrt(10^exp) = sqrt(n) * 10^(exp/2)
         *   
         *   Approximate sqrt(n) as simply n for our initial guess.  This
         *   will get us to the right order of magnitude plus or minus
         *   one, so we should converge pretty quickly.
         *   
         *   If we have an odd exponent, round up and divide the mantissa
         *   by 2 - this will be something like 0.456e7, which can be
         *   written as 4.56e6, whose square root is about 2e3, or .2e4.
         *   
         *   If we have an even exponent, multiply the mantissa by 2.
         *   This will be something like .456e8, whose square root is
         *   about .67e4.
         *   
         *   Note that it's well worth the trouble to make a good initial
         *   approximation, even with the multiply/divide, because these
         *   operations with longs are much more efficient than the full
         *   BigNum divide we'll have to do on each iteration.  
         */
        copy_val(ext1, src, TRUE);
        if ((get_exp(ext1) & 1) != 0)
        {
            /* odd exponent - round up and divide the mantissa by two */
            set_exp(ext1, (get_exp(ext1) + 1)/2);
            div_by_long(ext1, 2);
        }
        else
        {
            /* even exponent - multiply mantissa by two */
            set_exp(ext1, get_exp(ext1)/2);
            mul_by_long(ext1, 2);
        }

        /* iterate until we get close enough to the solution */
        for (;;)
        {
            char *tmp;
            size_t idx;
            
            /* 
             *   Calculate the next iteration's approximation, noting that r1
             *   contains the current iteration's value p:
             *   
             *   p' = p/2 + src/2p = (p + src/p)/2
             *   
             *   Note that if p == 0, we can't compute src/p, so we can't
             *   iterate any further.  
             */
            if (is_zero(ext1))
                break;

            /* calculate src/p into r3 */
            compute_quotient_into(ext3, 0, src, ext1);

            /* compute p + src/p into r4 */
            compute_sum_into(ext4, ext1, ext3);

            /* compute (p + src/p)/2 into r4 */
            div_by_long(ext4, 2);

            /* 
             *   check for convergence - if the new value equals the old
             *   value to the precision requested for the result, we are
             *   at the limit of our ability to distinguish differences in
             *   future terms, so we can stop 
             */
            if (get_neg(ext1) == get_neg(ext4)
                && get_exp(ext1) == get_exp(ext4))
            {
                /* 
                 *   they're the same sign and magnitude - compare the
                 *   digits to see where they first differ 
                 */
                for (idx = 0 ; idx < dst_prec + 1 ; ++idx)
                {
                    /* if they differ here, stop scanning */
                    if (get_dig(ext1, idx) != get_dig(ext4, idx))
                        break;
                }

                /* 
                 *   if we didn't find any difference up to the output
                 *   precision plus one digit (for rounding), further
                 *   iteration will be of no value 
                 */
                if (idx >= dst_prec + 1)
                    break;
            }

            /* swap the new value into r1 for the next round */
            tmp = ext1;
            ext1 = ext4;
            ext4 = tmp;
        }

        /* 
         *   copy the last iteration's value into the destination,
         *   rounding as needed 
         */
        copy_val(dst, ext1, TRUE);
    }